

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O1

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  sexp_conflict psVar2;
  
  iVar1 = strcmp(version,"0.11.0");
  psVar2 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      sexp_define_foreign_aux(ctx,env,"heap-stats",0,0,"sexp_heap_stats",sexp_heap_stats,0);
      sexp_define_foreign_aux(ctx,env,"heap-sizes",0,0,"sexp_heap_sizes",sexp_heap_sizes,0);
      sexp_define_foreign_aux(ctx,env,"heap-dump",1,1,"sexp_heap_dump",sexp_heap_dump,3);
      sexp_define_foreign_aux(ctx,env,"free-sizes",0,0,"sexp_free_sizes",sexp_free_sizes,0);
      psVar2 = (sexp_conflict)0x43e;
    }
  }
  return psVar2;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_define_foreign(ctx, env, "heap-stats", 0, sexp_heap_stats);
  sexp_define_foreign(ctx, env, "heap-sizes", 0, sexp_heap_sizes);
  sexp_define_foreign_opt(ctx, env, "heap-dump", 1, sexp_heap_dump, SEXP_ONE);
  sexp_define_foreign(ctx, env, "free-sizes", 0, sexp_free_sizes);
  return SEXP_VOID;
}